

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmidiin.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  pointer puVar2;
  RtMidiIn *pRVar3;
  ostream *poVar4;
  size_type sVar5;
  byte *pbVar6;
  string local_e8 [36];
  undefined4 local_c4;
  RtMidiError *error_1;
  string local_b0 [32];
  uint local_90;
  uint local_8c;
  uint nPorts;
  uint port;
  RtMidiError *error;
  string local_78 [48];
  double local_48;
  double stamp;
  int i;
  int nBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  RtMidiIn *midiin;
  char **argv_local;
  int argc_local;
  
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  if (2 < argc) {
    usage();
  }
  pRVar3 = (RtMidiIn *)operator_new(0x10);
  error._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"RtMidi Input Client",(allocator<char> *)((long)&error + 7));
  RtMidiIn::RtMidiIn(pRVar3,0,local_78);
  error._6_1_ = 0;
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pRVar3;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error + 7));
  local_8c = 0;
  local_90 = (**(code **)(*(long *)message.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10))();
  if (argc == 2) {
    local_8c = atoi(argv[1]);
  }
  if (local_90 <= local_8c) {
    if (message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(*(long *)message.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 0x40))();
    }
    std::operator<<((ostream *)&std::cout,"Invalid port specifier!\n");
    usage();
  }
  puVar2 = message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  uVar1 = local_8c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"RtMidi Input",(allocator<char> *)((long)&error_1 + 7));
  (*(code *)**(undefined8 **)puVar2)(puVar2,uVar1,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error_1 + 7));
  RtMidiIn::ignoreTypes
            ((RtMidiIn *)
             message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,false,false,false);
  done = false;
  signal(2,finish);
  poVar4 = std::operator<<((ostream *)&std::cout,"Reading MIDI from port ");
  (**(code **)(*(long *)message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x18))
            (local_e8,message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  poVar4 = std::operator<<(poVar4,local_e8);
  std::operator<<(poVar4," ... quit with Ctrl-C.\n");
  std::__cxx11::string::~string(local_e8);
  while (((done ^ 0xffU) & 1) != 0) {
    local_48 = RtMidiIn::getMessage
                         ((RtMidiIn *)
                          message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    stamp._4_4_ = (int)sVar5;
    for (stamp._0_4_ = 0; stamp._0_4_ < stamp._4_4_; stamp._0_4_ = stamp._0_4_ + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Byte ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,stamp._0_4_);
      poVar4 = std::operator<<(poVar4," = ");
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (long)stamp._0_4_);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)*pbVar6);
      std::operator<<(poVar4,", ");
    }
    if (0 < stamp._4_4_) {
      poVar4 = std::operator<<((ostream *)&std::cout,"stamp = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    usleep(10000);
  }
  if (message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (**(code **)(*(long *)message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 0x40))();
  }
  local_c4 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
  RtMidiIn *midiin = 0;
  std::vector<unsigned char> message;
  int nBytes, i;
  double stamp;

  // Minimal command-line check.
  if ( argc > 2 ) usage();

  // RtMidiIn constructor
  try {
    midiin = new RtMidiIn();
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    exit( EXIT_FAILURE );
  }

  // Check available ports vs. specified.
  unsigned int port = 0;
  unsigned int nPorts = midiin->getPortCount();
  if ( argc == 2 ) port = (unsigned int) atoi( argv[1] );
  if ( port >= nPorts ) {
    delete midiin;
    std::cout << "Invalid port specifier!\n";
    usage();
  }

  try {
    midiin->openPort( port );
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  // Don't ignore sysex, timing, or active sensing messages.
  midiin->ignoreTypes( false, false, false );

  // Install an interrupt handler function.
  done = false;
  (void) signal(SIGINT, finish);

  // Periodically check input queue.
  std::cout << "Reading MIDI from port " << midiin->getPortName() << " ... quit with Ctrl-C.\n";
  while ( !done ) {
    stamp = midiin->getMessage( &message );
    nBytes = message.size();
    for ( i=0; i<nBytes; i++ )
      std::cout << "Byte " << i << " = " << (int)message[i] << ", ";
    if ( nBytes > 0 )
      std::cout << "stamp = " << stamp << std::endl;

    // Sleep for 10 milliseconds.
    SLEEP( 10 );
  }

  // Clean up
 cleanup:
  delete midiin;

  return 0;
}